

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void tcp_connection_write_cb(uv_write_t *req,int status)

{
  if (req->handle == (uv_stream_t *)&conn.conn) {
    uv_close(0x2b4f20,close_cb);
    uv_close(&channel,close_cb);
    uv_close(&tcp_server,close_cb);
    tcp_conn_write_cb_called = tcp_conn_write_cb_called + 1;
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,0x250,"(uv_handle_t*)&conn.conn == (uv_handle_t*)req->handle");
  abort();
}

Assistant:

static void tcp_connection_write_cb(uv_write_t* req, int status) {
  ASSERT((uv_handle_t*)&conn.conn == (uv_handle_t*)req->handle);
  uv_close((uv_handle_t*)req->handle, close_cb);
  uv_close((uv_handle_t*)&channel, close_cb);
  uv_close((uv_handle_t*)&tcp_server, close_cb);
  tcp_conn_write_cb_called++;
}